

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxgeometsc.hpp
# Opt level: O0

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* soplex::
  computeScalingVec<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
            (SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             *vecset,vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                     *coScaleval,
            vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
            *scaleval,
            number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
            *epsilon)

{
  uint uVar1;
  bool bVar2;
  type_conflict5 tVar3;
  int iVar4;
  char *pcVar5;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_RCX;
  int __c;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_RDX;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_RDI;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  p;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  x;
  int j;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  mini;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  maxi;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *vec;
  int i;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pmax;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_3;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_3;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_1;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_false>
  precision_guard_2;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *result_2;
  undefined4 in_stack_fffffffffffffad8;
  int in_stack_fffffffffffffadc;
  undefined7 in_stack_fffffffffffffae0;
  undefined1 in_stack_fffffffffffffae7;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *in_stack_fffffffffffffae8;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffaf0;
  undefined1 local_4e8 [48];
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb48;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffffb50;
  double in_stack_fffffffffffffb60;
  cpp_dec_float<50U,_int,_void> *in_stack_fffffffffffffb68;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_478;
  undefined8 local_440;
  undefined1 local_438 [56];
  undefined8 local_400;
  undefined8 local_3f8;
  undefined8 local_3f0;
  undefined1 local_3e4 [56];
  undefined1 local_3ac [56];
  undefined1 local_374 [56];
  undefined1 local_33c [56];
  undefined1 local_304 [56];
  uint local_2cc;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_2c8;
  undefined8 local_290;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_288;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_250;
  uint local_244;
  undefined8 local_240 [2];
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_230;
  vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
  *local_228;
  undefined8 local_210;
  undefined8 *local_208;
  undefined8 local_1f8;
  undefined8 *local_1f0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1e8;
  undefined8 local_1e0;
  undefined8 local_1d8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1d0;
  undefined8 local_1c8;
  undefined8 local_1c0;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_198;
  undefined1 *local_190;
  reference local_188;
  undefined1 *local_180;
  undefined1 *local_170;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_168;
  undefined1 *local_160;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 *local_140;
  undefined8 *local_138;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_129;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_108;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined1 *local_f8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_e9;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_e0;
  undefined1 *local_d8;
  undefined1 *local_d0;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_c0;
  undefined1 *local_b8;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_a9;
  const_reference local_a8;
  cpp_dec_float<50U,_int,_void> *local_a0;
  undefined1 *local_98;
  undefined1 *local_90;
  const_reference local_88;
  cpp_dec_float<50U,_int,_void> *local_80;
  undefined1 *local_78;
  undefined8 *local_70;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_68;
  undefined8 *local_60;
  undefined8 *local_58;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_50;
  undefined8 *local_48;
  scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
  local_39;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_38;
  undefined8 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_18;
  undefined1 *local_10;
  undefined8 *local_8;
  
  local_240[0] = 0;
  local_208 = local_240;
  local_210 = 0;
  local_230 = in_RCX;
  local_228 = in_RDX;
  local_138 = local_208;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8,
             (type *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
  for (local_244 = 0; uVar1 = local_244,
      iVar4 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::num((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     *)0x146831), (int)uVar1 < iVar4; local_244 = local_244 + 1) {
    local_250 = SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::operator[]((SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                             in_stack_fffffffffffffadc);
    local_290 = 0;
    local_1e8 = &local_288;
    local_1f0 = &local_290;
    local_1f8 = 0;
    local_140 = local_1f0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8,
               (type *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    local_1d8 = infinity();
    local_1d0 = &local_2c8;
    local_1e0 = 0;
    local_148 = local_1d8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8,
               (type *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    for (local_2cc = 0; uVar1 = local_2cc,
        iVar4 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::size(local_250), (int)uVar1 < iVar4; local_2cc = local_2cc + 1) {
      in_stack_fffffffffffffaf0 =
           &SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::value(local_250,local_2cc)->m_backend;
      in_stack_fffffffffffffae8 = local_228;
      pcVar5 = SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ::index(local_250,(char *)(ulong)local_2cc,__c);
      local_a8 = std::
                 vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                 ::operator[](in_stack_fffffffffffffae8,(ulong)pcVar5 & 0xffffffff);
      local_98 = local_33c;
      local_a0 = in_stack_fffffffffffffaf0;
      boost::multiprecision::detail::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
      ::
      scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                (&local_a9,
                 (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)in_stack_fffffffffffffaf0,local_a8);
      local_90 = local_33c;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
      local_78 = local_33c;
      local_80 = local_a0;
      local_88 = local_a8;
      boost::multiprecision::default_ops::
      eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                 (cpp_dec_float<50U,_int,_void> *)0x146a3b);
      spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                  *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      local_1a8 = local_374;
      local_1b0 = local_304;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      local_198 = local_3ac;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
      bVar2 = isZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                        (in_stack_fffffffffffffb50,in_stack_fffffffffffffb48);
      if (!bVar2) {
        tVar3 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x146ae9);
        if (tVar3) {
          local_158 = &local_288;
          local_160 = local_304;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        }
        tVar3 = boost::multiprecision::operator<
                          ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                           (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)0x146b39);
        if (tVar3) {
          local_168 = &local_2c8;
          local_170 = local_304;
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                    ((cpp_dec_float<50U,_int,_void> *)
                     CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                     (cpp_dec_float<50U,_int,_void> *)
                     CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
        }
      }
    }
    local_1c0 = infinity();
    local_1b8 = local_3e4;
    local_1c8 = 0;
    local_150 = local_1c0;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
              (in_stack_fffffffffffffaf0,(double)in_stack_fffffffffffffae8,
               (type *)CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    bVar2 = boost::multiprecision::operator==
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x146bf9);
    in_stack_fffffffffffffae7 = true;
    if (!bVar2) {
      local_3f0 = 0;
      in_stack_fffffffffffffae7 =
           boost::multiprecision::operator==
                     ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                      (double *)0x146c27);
    }
    if ((type_conflict5)in_stack_fffffffffffffae7 != false) {
      local_3f8 = 0x3ff0000000000000;
      local_50 = &local_2c8;
      local_58 = &local_3f8;
      local_48 = local_58;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
      local_400 = 0x3ff0000000000000;
      local_68 = &local_288;
      local_70 = &local_400;
      local_60 = local_70;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                (in_stack_fffffffffffffb68,in_stack_fffffffffffffb60);
    }
    local_440 = 0x3ff0000000000000;
    local_d8 = &stack0xfffffffffffffb50;
    local_e0 = &local_2c8;
    local_e8 = &local_288;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_e9,local_e0,local_e8);
    local_d0 = &stack0xfffffffffffffb50;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    local_b8 = &stack0xfffffffffffffb50;
    local_c0 = local_e0;
    local_c8 = local_e8;
    boost::multiprecision::default_ops::
    eval_multiply<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (cpp_dec_float<50U,_int,_void> *)0x146dab);
    spxSqrt<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    local_28 = local_438;
    local_30 = &local_440;
    local_38 = &local_478;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_39,local_38);
    local_20 = local_438;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    local_10 = local_438;
    local_8 = local_30;
    local_18 = local_38;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,double,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (double *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (cpp_dec_float<50U,_int,_void> *)0x146e6c);
    local_188 = std::
                vector<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                ::operator[](local_230,(ulong)local_244);
    local_190 = local_438;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    local_118 = local_4e8;
    local_120 = &local_288;
    local_128 = &local_2c8;
    boost::multiprecision::detail::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,false>
    ::
    scoped_default_precision<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
              (&local_129,local_120,local_128);
    local_110 = local_4e8;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0));
    local_f8 = local_4e8;
    local_100 = local_120;
    local_108 = local_128;
    boost::multiprecision::default_ops::
    eval_divide<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>,boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
              ((cpp_dec_float<50U,_int,_void> *)
               CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
               (cpp_dec_float<50U,_int,_void> *)
               CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
               (cpp_dec_float<50U,_int,_void> *)0x146f5d);
    tVar3 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8),
                       (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)0x146f6c);
    if (tVar3) {
      local_180 = local_4e8;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                ((cpp_dec_float<50U,_int,_void> *)
                 CONCAT17(in_stack_fffffffffffffae7,in_stack_fffffffffffffae0),
                 (cpp_dec_float<50U,_int,_void> *)
                 CONCAT44(in_stack_fffffffffffffadc,in_stack_fffffffffffffad8));
    }
  }
  return in_RDI;
}

Assistant:

static R computeScalingVec(
   const SVSetBase<R>*   vecset, const std::vector<R>& coScaleval,
   std::vector<R>&       scaleval, R epsilon)
{
   R pmax = 0.0;

   assert(scaleval.size() == unsigned(vecset->num()));

   for(int i = 0; i < vecset->num(); ++i)
   {
      const SVectorBase<R>& vec = (*vecset)[i];

      R maxi = 0.0;
      R mini = R(infinity);

      for(int j = 0; j < vec.size(); ++j)
      {
         const R x = spxAbs(vec.value(j) * coScaleval[unsigned(vec.index(j))]);

         if(!isZero(x, epsilon))
         {
            if(x > maxi)
               maxi = x;

            if(x < mini)
               mini = x;
         }
      }

      // empty rows/cols are possible
      if(mini == R(infinity) || maxi == 0.0)
      {
         mini = 1.0;
         maxi = 1.0;
      }

      assert(mini < R(infinity));
      assert(maxi > 0.0);

      scaleval[unsigned(i)] = 1.0 / spxSqrt(mini * maxi);

      const R p = maxi / mini;

      if(p > pmax)
         pmax = p;
   }

   return pmax;
}